

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodeframe_utils.h
# Opt level: O0

void enforce_max_ref_frames
               (AV1_COMP *cpi,int *ref_frame_flags,uint *ref_display_order_hint,
               uint cur_frame_display_index)

{
  int iVar1;
  undefined4 in_ECX;
  int *in_RDX;
  AV1_COMP *in_RSI;
  MV_REFERENCE_FRAME ref_frame_to_disable;
  int i;
  int max_allowed_refs;
  int total_valid_refs;
  MV_REFERENCE_FRAME ref_frame;
  int local_2c;
  uint cur_frame_display_index_00;
  undefined3 in_stack_ffffffffffffffe0;
  undefined4 uVar2;
  char cVar3;
  
  cur_frame_display_index_00 = 0;
  for (uVar2 = CONCAT13(1,in_stack_ffffffffffffffe0); cVar3 = (char)((uint)uVar2 >> 0x18),
      cVar3 < '\b'; uVar2 = CONCAT13(cVar3 + '\x01',(int3)uVar2)) {
    if ((*(uint *)&in_RSI->ppi & (uint)""[cVar3]) != 0) {
      cur_frame_display_index_00 = cur_frame_display_index_00 + 1;
    }
  }
  iVar1 = get_max_allowed_ref_frames
                    (in_RSI,in_RDX,(uint *)CONCAT44(in_ECX,uVar2),cur_frame_display_index_00);
  for (local_2c = 0; local_2c < 4 && iVar1 < (int)cur_frame_display_index_00;
      local_2c = local_2c + 1) {
    if ((*(uint *)&in_RSI->ppi & (uint)""["\x03\x02\x06\x05"[local_2c]]) != 0) {
      switch("\x03\x02\x06\x05"[local_2c]) {
      case '\x02':
        *(uint *)&in_RSI->ppi = *(uint *)&in_RSI->ppi & 0xfffffffd;
        break;
      case '\x03':
        *(uint *)&in_RSI->ppi = *(uint *)&in_RSI->ppi & 0xfffffffb;
        break;
      default:
        break;
      case '\x05':
        *(uint *)&in_RSI->ppi = *(uint *)&in_RSI->ppi & 0xfffffff7;
        break;
      case '\x06':
        *(uint *)&in_RSI->ppi = *(uint *)&in_RSI->ppi & 0xffffffdf;
      }
      cur_frame_display_index_00 = cur_frame_display_index_00 - 1;
    }
  }
  return;
}

Assistant:

static inline void enforce_max_ref_frames(
    AV1_COMP *cpi, int *ref_frame_flags,
    const unsigned int *ref_display_order_hint,
    unsigned int cur_frame_display_index) {
  MV_REFERENCE_FRAME ref_frame;
  int total_valid_refs = 0;

  for (ref_frame = LAST_FRAME; ref_frame <= ALTREF_FRAME; ++ref_frame) {
    if (*ref_frame_flags & av1_ref_frame_flag_list[ref_frame]) {
      total_valid_refs++;
    }
  }

  const int max_allowed_refs = get_max_allowed_ref_frames(
      cpi, ref_frame_flags, ref_display_order_hint, cur_frame_display_index);

  for (int i = 0; i < 4 && total_valid_refs > max_allowed_refs; ++i) {
    const MV_REFERENCE_FRAME ref_frame_to_disable = disable_order[i];

    if (!(*ref_frame_flags & av1_ref_frame_flag_list[ref_frame_to_disable])) {
      continue;
    }

    switch (ref_frame_to_disable) {
      case LAST3_FRAME: *ref_frame_flags &= ~AOM_LAST3_FLAG; break;
      case LAST2_FRAME: *ref_frame_flags &= ~AOM_LAST2_FLAG; break;
      case ALTREF2_FRAME: *ref_frame_flags &= ~AOM_ALT2_FLAG; break;
      case BWDREF_FRAME: *ref_frame_flags &= ~AOM_GOLD_FLAG; break;
      default: assert(0);
    }
    --total_valid_refs;
  }
  assert(total_valid_refs <= max_allowed_refs);
}